

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O3

void __thiscall CodeWriter::finish(CodeWriter *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"main_end","");
  tag(this,&local_38,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->halt)._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->newLine)._M_dataplus._M_p);
  return;
}

Assistant:

void CodeWriter::finish() {
    tag("main_end");
    moonOutput += halt;
    moonOutput += newLine;
}